

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

int SimpleString::AtoI(char *str)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  do {
    bVar1 = *str;
    uVar3 = (ulong)bVar1;
    if (0x2d < uVar3) {
LAB_00130805:
      iVar4 = 0;
      for (; (byte)(*str - 0x30U) < 10; str = (char *)((byte *)str + 1)) {
        iVar4 = iVar4 * 10 + (uint)(byte)*str + -0x30;
      }
      iVar2 = -iVar4;
      if (bVar1 != 0x2d) {
        iVar2 = iVar4;
      }
      return iVar2;
    }
    if ((0x100003e00U >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x280000000000U >> (uVar3 & 0x3f) & 1) != 0) {
        str = (char *)((byte *)str + 1);
      }
      goto LAB_00130805;
    }
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

int SimpleString::AtoI(const char* str)
{
    while (isSpace(*str)) str++;

    char first_char = *str;
    if (first_char == '-' || first_char == '+') str++;

    int  result = 0;
    for(; isDigit(*str); str++)
    {
        result *= 10;
        result += *str - '0';
    }
    return (first_char == '-') ? -result : result;
}